

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  char *pcVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char acStack_6c [4];
  char *local_68;
  undefined8 local_60;
  char *local_58;
  ulong local_50;
  unsigned_long *local_48;
  idx_t local_40;
  bool *local_38;
  
  local_38 = result_data;
  local_48 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (local_48 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = (rdata->value).pointer.ptr;
      uVar2 = (uint)*(ulong *)&rdata->value;
      uVar13 = *(ulong *)&rdata->value & 0xffffffff;
      pcVar9 = acStack_6c;
      if (0xc < uVar2) {
        pcVar9 = local_68;
      }
      iVar10 = 0;
      do {
        local_58 = ldata[iVar10].value.pointer.ptr;
        local_60 = *(undefined8 *)&ldata[iVar10].value;
        uVar1 = (uint)*(undefined8 *)&ldata[iVar10].value;
        if (uVar1 < uVar2) {
LAB_00a051e7:
          bVar8 = false;
        }
        else if (uVar2 < 5) {
          bVar8 = true;
          if (uVar2 != 0) {
            uVar5 = 0;
            do {
              if (*(char *)((long)&local_60 + uVar5 + 4) != acStack_6c[uVar5]) goto LAB_00a051e7;
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
        }
        else {
          lVar7 = 0;
          do {
            if (*(char *)((long)&local_60 + lVar7 + 4) != acStack_6c[lVar7]) goto LAB_00a051e7;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          if (uVar1 < 0xd) {
            local_58 = (char *)((long)&local_60 + 4);
          }
          uVar5 = 4;
          do {
            if (local_58[uVar5] != pcVar9[uVar5]) goto LAB_00a051e7;
            uVar5 = uVar5 + 1;
          } while (uVar13 != uVar5);
          bVar8 = true;
        }
        result_data[iVar10] = bVar8;
        iVar10 = iVar10 + 1;
      } while (iVar10 != count);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    uVar5 = 0;
    local_40 = count;
    uVar13 = 0;
    do {
      uVar12 = local_48[uVar5];
      uVar6 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar6 = count;
      }
      uVar3 = uVar6;
      if (uVar12 != 0) {
        uVar3 = uVar13;
        if (uVar12 == 0xffffffffffffffff) {
          if (uVar13 < uVar6) {
            local_68 = (rdata->value).pointer.ptr;
            uVar2 = (uint)*(ulong *)&rdata->value;
            uVar12 = *(ulong *)&rdata->value & 0xffffffff;
            pcVar9 = local_68;
            if (uVar2 < 0xd) {
              pcVar9 = acStack_6c;
            }
            do {
              local_58 = ldata[uVar13].value.pointer.ptr;
              local_60 = *(undefined8 *)&ldata[uVar13].value;
              uVar1 = (uint)*(undefined8 *)&ldata[uVar13].value;
              if (uVar1 < uVar2) {
LAB_00a05016:
                bVar8 = false;
              }
              else if (uVar2 < 5) {
                bVar8 = true;
                if (uVar2 != 0) {
                  uVar3 = 0;
                  do {
                    if (*(char *)((long)&local_60 + uVar3 + 4) != acStack_6c[uVar3])
                    goto LAB_00a05016;
                    uVar3 = uVar3 + 1;
                  } while (uVar12 != uVar3);
                }
              }
              else {
                lVar7 = 0;
                do {
                  if (*(char *)((long)&local_60 + lVar7 + 4) != acStack_6c[lVar7])
                  goto LAB_00a05016;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                if (uVar1 < 0xd) {
                  local_58 = (char *)((long)&local_60 + 4);
                }
                uVar3 = 4;
                do {
                  if (local_58[uVar3] != pcVar9[uVar3]) goto LAB_00a05016;
                  uVar3 = uVar3 + 1;
                } while (uVar12 != uVar3);
                bVar8 = true;
              }
              result_data[uVar13] = bVar8;
              uVar13 = uVar13 + 1;
              uVar3 = uVar6;
            } while (uVar13 != uVar6);
          }
        }
        else {
          uVar11 = uVar13;
          if (uVar13 < uVar6) {
            do {
              if ((uVar12 >> ((ulong)(uint)((int)uVar11 - (int)uVar13) & 0x3f) & 1) != 0) {
                local_58 = ldata[uVar11].value.pointer.ptr;
                local_68 = (rdata->value).pointer.ptr;
                local_60 = *(undefined8 *)&ldata[uVar11].value;
                uVar1 = (uint)*(ulong *)&rdata->value;
                uVar2 = (uint)*(undefined8 *)&ldata[uVar11].value;
                if (uVar2 < uVar1) {
LAB_00a050de:
                  bVar8 = false;
                }
                else {
                  uVar3 = *(ulong *)&rdata->value & 0xffffffff;
                  if (uVar1 < 5) {
                    bVar8 = true;
                    if (uVar1 != 0) {
                      uVar4 = 0;
                      do {
                        if (*(char *)((long)&local_60 + uVar4 + 4) != acStack_6c[uVar4])
                        goto LAB_00a050de;
                        uVar4 = uVar4 + 1;
                      } while (uVar3 != uVar4);
                    }
                  }
                  else {
                    lVar7 = 0;
                    do {
                      if (*(char *)((long)&local_60 + lVar7 + 4) != acStack_6c[lVar7])
                      goto LAB_00a050de;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    if (uVar2 < 0xd) {
                      local_58 = (char *)((long)&local_60 + 4);
                    }
                    if (uVar1 < 0xd) {
                      local_68 = acStack_6c;
                    }
                    uVar4 = 4;
                    do {
                      if (local_58[uVar4] != local_68[uVar4]) goto LAB_00a050de;
                      uVar4 = uVar4 + 1;
                    } while (uVar3 != uVar4);
                    bVar8 = true;
                  }
                }
                result_data[uVar11] = bVar8;
              }
              uVar11 = uVar11 + 1;
              uVar3 = uVar6;
            } while (uVar11 != uVar6);
          }
        }
      }
      uVar5 = uVar5 + 1;
      uVar13 = uVar3;
    } while (uVar5 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}